

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InfinityTests.cpp
# Opt level: O0

void __thiscall IsNotInfinityTests::IsNotInfinityTests(IsNotInfinityTests *this)

{
  IsNotInfinityTests *this_local;
  
  ut11::TestFixture::TestFixture(&this->super_TestFixture);
  (this->super_TestFixture).super_TestFixtureAbstract._vptr_TestFixtureAbstract =
       (_func_int **)&PTR__IsNotInfinityTests_00614b90;
  return;
}

Assistant:

virtual void Run()
	{
		Then("Is::Not::Infinity(0.0f) is Not::False", []() {
			AssertThat(ut11::Is::Not::Infinity(0.0f), ut11::Is::Not::False);
		});

		Then("Is::Not::Infinity(Infinity) is Not::True", []() {
			AssertThat(ut11::Is::Not::Infinity(std::numeric_limits<float>::infinity()), ut11::Is::Not::True);
			AssertThat(ut11::Is::Not::Infinity(-std::numeric_limits<float>::infinity()), ut11::Is::Not::True);
		});

		Then("Is::Not::Infinity is Operand", []() {
			AssertThat(ut11::detail::IsOperand< decltype(ut11::Is::Not::Infinity) >::value, ut11::Is::True);
		});

		Then("Is::Not::Infinity has an error message", []() {
			AssertThat(ut11::Is::Not::Infinity.GetErrorMessage(0.0f), ut11::Is::Not::EqualTo(""));
		});

	}